

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int local_4d8;
  int n;
  int limit2show;
  int last;
  lua_Debug ar;
  luaL_Buffer b;
  int level_local;
  char *msg_local;
  lua_State *L1_local;
  lua_State *L_local;
  
  iVar1 = lastlevel(L1);
  local_4d8 = -1;
  if (0x15 < iVar1 - level) {
    local_4d8 = 10;
  }
  luaL_buffinit(L,(luaL_Buffer *)&ar.i_ci);
  if (msg != (char *)0x0) {
    luaL_addstring((luaL_Buffer *)&ar.i_ci,msg);
    if (b.b <= b.size) {
      luaL_prepbuffsize((luaL_Buffer *)&ar.i_ci,1);
    }
    *(undefined1 *)((long)&(ar.i_ci)->func + b.size) = 10;
  }
  luaL_addstring((luaL_Buffer *)&ar.i_ci,"stack traceback:");
  b.init._1020_4_ = level;
  while( true ) {
    iVar2 = b.init._1020_4_ + 1;
    iVar3 = lua_getstack(L1,b.init._1020_4_,(lua_Debug *)&limit2show);
    if (iVar3 == 0) break;
    iVar3 = local_4d8 + -1;
    if (local_4d8 == 0) {
      uVar4 = (iVar1 - iVar2) - 10;
      lua_pushfstring(L,"\n\t...\t(skipping %d levels)",(ulong)uVar4);
      luaL_addvalue((luaL_Buffer *)&ar.i_ci);
      local_4d8 = iVar3;
      b.init._1020_4_ = uVar4 + iVar2;
    }
    else {
      lua_getinfo(L1,"Slnt",(lua_Debug *)&limit2show);
      if ((int)(uint)ar.srclen < 1) {
        lua_pushfstring(L,"\n\t%s: in ",&ar.nups);
      }
      else {
        lua_pushfstring(L,"\n\t%s:%d: in ",&ar.nups,(ulong)(uint)ar.srclen);
      }
      luaL_addvalue((luaL_Buffer *)&ar.i_ci);
      pushfuncname(L,(lua_Debug *)&limit2show);
      luaL_addvalue((luaL_Buffer *)&ar.i_ci);
      local_4d8 = iVar3;
      b.init._1020_4_ = iVar2;
      if (ar.linedefined._3_1_ != '\0') {
        luaL_addstring((luaL_Buffer *)&ar.i_ci,"\n\t(...tail calls...)");
      }
    }
  }
  luaL_pushresult((luaL_Buffer *)&ar.i_ci);
  return;
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1,
                                const char *msg, int level) {
  luaL_Buffer b;
  lua_Debug ar;
  int last = lastlevel(L1);
  int limit2show = (last - level > LEVELS1 + LEVELS2) ? LEVELS1 : -1;
  luaL_buffinit(L, &b);
  if (msg) {
    luaL_addstring(&b, msg);
    luaL_addchar(&b, '\n');
  }
  luaL_addstring(&b, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    if (limit2show-- == 0) {  /* too many levels? */
      int n = last - level - LEVELS2 + 1;  /* number of levels to skip */
      lua_pushfstring(L, "\n\t...\t(skipping %d levels)", n);
      luaL_addvalue(&b);  /* add warning about skip */
      level += n;  /* and skip to last levels */
    }
    else {
      lua_getinfo(L1, "Slnt", &ar);
      if (ar.currentline <= 0)
        lua_pushfstring(L, "\n\t%s: in ", ar.short_src);
      else
        lua_pushfstring(L, "\n\t%s:%d: in ", ar.short_src, ar.currentline);
      luaL_addvalue(&b);
      pushfuncname(L, &ar);
      luaL_addvalue(&b);
      if (ar.istailcall)
        luaL_addstring(&b, "\n\t(...tail calls...)");
    }
  }
  luaL_pushresult(&b);
}